

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBufferWriteTests.cpp
# Opt level: O0

int __thiscall
deqp::gles2::Functional::BufferWriteTests::init(BufferWriteTests *this,EVP_PKEY_CTX *ctx)

{
  allocator<deqp::gles2::Functional::DataStoreSpec> *this_00;
  deUint32 dVar1;
  Context *pCVar2;
  bool bVar3;
  deBool dVar4;
  int iVar5;
  deUint32 dVar6;
  TestNode *pTVar7;
  char *pcVar8;
  BasicBufferDataCase *pBVar9;
  TestNode *node;
  DataStoreSpecVecBuilder *pDVar10;
  RecreateBufferDataStoreCase *pRVar11;
  reference pvVar12;
  size_type sVar13;
  pointer pDVar14;
  SubDataToUndefinedCase *pSVar15;
  reference pvVar16;
  RangeVecBuilder *pRVar17;
  ulong extraout_RAX;
  RandomBufferWriteCase *this_01;
  ulong uVar18;
  string local_6c0;
  uint local_69c;
  TestNode *pTStack_698;
  int i;
  TestCaseGroup *randomGroup;
  Vector<int,_2> local_688;
  RangeVecBuilder local_680;
  RangeVecBuilder builder_18;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> ranges_12;
  Vector<int,_2> local_658;
  RangeVecBuilder local_650;
  RangeVecBuilder builder_17;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> ranges_11;
  RangeVecBuilder local_628;
  RangeVecBuilder builder_16;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> ranges_10;
  Vector<int,_2> local_600;
  RangeVecBuilder local_5f8;
  RangeVecBuilder builder_15;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> ranges_9;
  Vector<int,_2> local_5d0;
  RangeVecBuilder local_5c8;
  RangeVecBuilder builder_14;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> ranges_8;
  RangeVecBuilder local_5a0;
  RangeVecBuilder builder_13;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> ranges_7;
  Vector<int,_2> local_578;
  RangeVecBuilder local_570;
  RangeVecBuilder builder_12;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> ranges_6;
  Vector<int,_2> local_548;
  RangeVecBuilder local_540;
  RangeVecBuilder builder_11;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> ranges_5;
  RangeVecBuilder local_518;
  RangeVecBuilder builder_10;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> ranges_4;
  Vector<int,_2> local_4f0;
  Vector<int,_2> local_4e8;
  RangeVecBuilder local_4e0;
  RangeVecBuilder builder_9;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> ranges_3;
  Vector<int,_2> local_4b8;
  Vector<int,_2> local_4b0;
  RangeVecBuilder local_4a8;
  RangeVecBuilder builder_8;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> ranges_2;
  Vector<int,_2> local_480;
  RangeVecBuilder local_478;
  RangeVecBuilder builder_7;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> ranges_1;
  RangeVecBuilder local_450;
  RangeVecBuilder builder_6;
  vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> ranges;
  TestCaseGroup *partialSpecifyGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  undefined1 local_3e0 [8];
  string name_2;
  VerifyType verify_3;
  int size_2;
  deUint32 usage_2;
  deUint32 target_2;
  int usageNdx_1;
  int targetNdx_2;
  TestCaseGroup *basicGroup_1;
  string local_398;
  allocator<char> local_371;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  DataStoreSpec *local_330;
  __normal_iterator<deqp::gles2::Functional::DataStoreSpec_*,_std::vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>_>
  local_328;
  __normal_iterator<deqp::gles2::Functional::DataStoreSpec_*,_std::vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>_>
  local_320;
  iterator spec;
  undefined1 local_310 [8];
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  specs_6;
  int caseNdx;
  Random rnd;
  VerifyType verify_2;
  int maxSize;
  int minSize;
  int numUploadsPerCase;
  int numRandomCases;
  DataStoreSpec local_2c4;
  DataStoreSpec local_2b8;
  DataStoreSpec local_2ac;
  DataStoreSpec local_2a0;
  DataStoreSpec local_294;
  DataStoreSpecVecBuilder local_288;
  DataStoreSpecVecBuilder builder_5;
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  specs_5;
  DataStoreSpec local_25c;
  DataStoreSpec local_250;
  DataStoreSpec local_244;
  DataStoreSpecVecBuilder local_238;
  DataStoreSpecVecBuilder builder_4;
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  specs_4;
  DataStoreSpec local_208;
  DataStoreSpec local_1fc;
  DataStoreSpecVecBuilder local_1f0;
  DataStoreSpecVecBuilder builder_3;
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  specs_3;
  DataStoreSpec local_1c4;
  DataStoreSpecVecBuilder local_1b8;
  DataStoreSpecVecBuilder builder_2;
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  specs_2;
  DataStoreSpec local_188;
  DataStoreSpec local_17c;
  DataStoreSpecVecBuilder local_170;
  DataStoreSpecVecBuilder builder_1;
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  specs_1;
  DataStoreSpec local_140;
  DataStoreSpec local_134;
  DataStoreSpecVecBuilder local_128;
  DataStoreSpecVecBuilder builder;
  vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
  specs;
  TestCaseGroup *recreateStoreGroup;
  string local_f8 [8];
  string name_1;
  VerifyType verify_1;
  int size_1;
  deUint32 usage_1;
  deUint32 target_1;
  int targetNdx_1;
  TestCaseGroup *verifyGroup;
  int verifyNdx;
  TestCaseGroup *useGroup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [8];
  string name;
  VerifyType verify;
  int size;
  deUint32 usage;
  deUint32 target;
  int usageNdx;
  int targetNdx;
  TestCaseGroup *basicGroup;
  BufferWriteTests *this_local;
  
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"basic",
             "Basic upload with glBufferData()");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  for (target = 0; (int)target < 2; target = target + 1) {
    for (usage = 0; (int)usage < 3; usage = usage + 1) {
      dVar6 = init::bufferTargets[(int)target];
      dVar1 = init::usageHints[(int)usage];
      name.field_2._12_4_ = 0;
      pcVar8 = BufferTestUtil::getBufferTargetName(dVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a0,pcVar8,(allocator<char> *)((long)&useGroup + 7));
      std::operator+(&local_80,&local_a0,"_");
      pcVar8 = BufferTestUtil::getUsageHintName(dVar1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     &local_80,pcVar8);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_a0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&useGroup + 7));
      pBVar9 = (BasicBufferDataCase *)operator_new(0xd0);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      pcVar8 = (char *)std::__cxx11::string::c_str();
      BasicBufferDataCase::BasicBufferDataCase
                (pBVar9,pCVar2,pcVar8,"",dVar6,dVar1,0x3fc,VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar7,(TestNode *)pBVar9);
      std::__cxx11::string::~string((string *)local_60);
    }
  }
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"use",
             "Buffer uses");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  for (verifyGroup._4_4_ = 0; verifyGroup._4_4_ < 2; verifyGroup._4_4_ = verifyGroup._4_4_ + 1) {
    node = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)node,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::verifyTypes[verifyGroup._4_4_].name,"");
    tcu::TestNode::addChild(pTVar7,node);
    for (usage_1 = 0; (int)usage_1 < 2; usage_1 = usage_1 + 1) {
      dVar6 = init::bufferTargets[(int)usage_1];
      name_1.field_2._12_4_ = init::verifyTypes[verifyGroup._4_4_].verify;
      pcVar8 = BufferTestUtil::getBufferTargetName(dVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_f8,pcVar8,(allocator<char> *)((long)&recreateStoreGroup + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&recreateStoreGroup + 7));
      pBVar9 = (BasicBufferDataCase *)operator_new(0xd0);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      pcVar8 = (char *)std::__cxx11::string::c_str();
      BasicBufferDataCase::BasicBufferDataCase
                (pBVar9,pCVar2,pcVar8,"",dVar6,0x88e4,0x2fb,name_1.field_2._12_4_);
      tcu::TestNode::addChild(node,(TestNode *)pBVar9);
      std::__cxx11::string::~string(local_f8);
    }
  }
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "recreate_store","Data store recreate using glBufferData()");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  do {
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
    ::vector((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
              *)&builder);
    DataStoreSpecVecBuilder::DataStoreSpecVecBuilder
              (&local_128,
               (vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                *)&builder);
    DataStoreSpec::DataStoreSpec(&local_134,0x8892,0x88e4,0x3e4);
    pDVar10 = DataStoreSpecVecBuilder::operator<<(&local_128,&local_134);
    DataStoreSpec::DataStoreSpec(&local_140,0x8892,0x88e4,0x3e4);
    pDVar10 = DataStoreSpecVecBuilder::operator<<(pDVar10,&local_140);
    DataStoreSpec::DataStoreSpec
              ((DataStoreSpec *)
               ((long)&specs_1.
                       super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0x8892,0x88e4,0x3e4);
    DataStoreSpecVecBuilder::operator<<
              (pDVar10,(DataStoreSpec *)
                       ((long)&specs_1.
                               super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    pRVar11 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pvVar12 = std::
              vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
              ::operator[]((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                            *)&builder,0);
    sVar13 = std::
             vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
             ::size((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                     *)&builder);
    RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
              (pRVar11,pCVar2,"identical_1","Recreate with identical parameters",pvVar12,(int)sVar13
               ,VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pRVar11);
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
    ::~vector((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&builder);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
    ::vector((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
              *)&builder_1);
    DataStoreSpecVecBuilder::DataStoreSpecVecBuilder
              (&local_170,
               (vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                *)&builder_1);
    DataStoreSpec::DataStoreSpec(&local_17c,0x8893,0x88e4,0x48);
    pDVar10 = DataStoreSpecVecBuilder::operator<<(&local_170,&local_17c);
    DataStoreSpec::DataStoreSpec(&local_188,0x8893,0x88e4,0x48);
    pDVar10 = DataStoreSpecVecBuilder::operator<<(pDVar10,&local_188);
    DataStoreSpec::DataStoreSpec
              ((DataStoreSpec *)
               ((long)&specs_2.
                       super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0x8893,0x88e4,0x48);
    DataStoreSpecVecBuilder::operator<<
              (pDVar10,(DataStoreSpec *)
                       ((long)&specs_2.
                               super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    pRVar11 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pvVar12 = std::
              vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
              ::operator[]((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                            *)&builder_1,0);
    sVar13 = std::
             vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
             ::size((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                     *)&builder_1);
    RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
              (pRVar11,pCVar2,"identical_2","Recreate with identical parameters",pvVar12,(int)sVar13
               ,VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pRVar11);
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
    ::~vector((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&builder_1);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
    ::vector((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
              *)&builder_2);
    DataStoreSpecVecBuilder::DataStoreSpecVecBuilder
              (&local_1b8,
               (vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                *)&builder_2);
    DataStoreSpec::DataStoreSpec(&local_1c4,0x8892,0x88e4,0x1f8);
    pDVar10 = DataStoreSpecVecBuilder::operator<<(&local_1b8,&local_1c4);
    DataStoreSpec::DataStoreSpec
              ((DataStoreSpec *)
               &specs_3.
                super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,0x8893,0x88e4,0x1f8);
    DataStoreSpecVecBuilder::operator<<
              (pDVar10,(DataStoreSpec *)
                       &specs_3.
                        super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pRVar11 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pvVar12 = std::
              vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
              ::operator[]((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                            *)&builder_2,0);
    sVar13 = std::
             vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
             ::size((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                     *)&builder_2);
    RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
              (pRVar11,pCVar2,"different_target_1","Recreate with different target",pvVar12,
               (int)sVar13,VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pRVar11);
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
    ::~vector((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&builder_2);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
    ::vector((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
              *)&builder_3);
    DataStoreSpecVecBuilder::DataStoreSpecVecBuilder
              (&local_1f0,
               (vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                *)&builder_3);
    DataStoreSpec::DataStoreSpec(&local_1fc,0x8893,0x88e4,0x2cc);
    pDVar10 = DataStoreSpecVecBuilder::operator<<(&local_1f0,&local_1fc);
    DataStoreSpec::DataStoreSpec(&local_208,0x8892,0x88e4,0x2cc);
    pDVar10 = DataStoreSpecVecBuilder::operator<<(pDVar10,&local_208);
    DataStoreSpec::DataStoreSpec
              ((DataStoreSpec *)
               ((long)&specs_4.
                       super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0x8893,0x88e4,0x2cc);
    DataStoreSpecVecBuilder::operator<<
              (pDVar10,(DataStoreSpec *)
                       ((long)&specs_4.
                               super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    pRVar11 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pvVar12 = std::
              vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
              ::operator[]((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                            *)&builder_3,0);
    sVar13 = std::
             vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
             ::size((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                     *)&builder_3);
    RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
              (pRVar11,pCVar2,"different_target_2","Recreate with different target",pvVar12,
               (int)sVar13,VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pRVar11);
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
    ::~vector((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&builder_3);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
    ::vector((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
              *)&builder_4);
    DataStoreSpecVecBuilder::DataStoreSpecVecBuilder
              (&local_238,
               (vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                *)&builder_4);
    DataStoreSpec::DataStoreSpec(&local_244,0x8892,0x88e0,0x66c);
    pDVar10 = DataStoreSpecVecBuilder::operator<<(&local_238,&local_244);
    DataStoreSpec::DataStoreSpec(&local_250,0x8892,0x88e8,0x66c);
    pDVar10 = DataStoreSpecVecBuilder::operator<<(pDVar10,&local_250);
    DataStoreSpec::DataStoreSpec(&local_25c,0x8892,0x88e4,0x66c);
    pDVar10 = DataStoreSpecVecBuilder::operator<<(pDVar10,&local_25c);
    DataStoreSpec::DataStoreSpec
              ((DataStoreSpec *)
               &specs_5.
                super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,0x8892,0x88e0,0x66c);
    DataStoreSpecVecBuilder::operator<<
              (pDVar10,(DataStoreSpec *)
                       &specs_5.
                        super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pRVar11 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pvVar12 = std::
              vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
              ::operator[]((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                            *)&builder_4,0);
    sVar13 = std::
             vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
             ::size((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                     *)&builder_4);
    RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
              (pRVar11,pCVar2,"different_usage","Recreate with different usage",pvVar12,(int)sVar13,
               VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pRVar11);
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
    ::~vector((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&builder_4);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
    ::vector((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
              *)&builder_5);
    DataStoreSpecVecBuilder::DataStoreSpecVecBuilder
              (&local_288,
               (vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                *)&builder_5);
    DataStoreSpec::DataStoreSpec(&local_294,0x8892,0x88e0,0x400);
    pDVar10 = DataStoreSpecVecBuilder::operator<<(&local_288,&local_294);
    DataStoreSpec::DataStoreSpec(&local_2a0,0x8892,0x88e0,0xc);
    pDVar10 = DataStoreSpecVecBuilder::operator<<(pDVar10,&local_2a0);
    DataStoreSpec::DataStoreSpec(&local_2ac,0x8892,0x88e0,0xcff);
    pDVar10 = DataStoreSpecVecBuilder::operator<<(pDVar10,&local_2ac);
    DataStoreSpec::DataStoreSpec(&local_2b8,0x8892,0x88e0,0x5c);
    pDVar10 = DataStoreSpecVecBuilder::operator<<(pDVar10,&local_2b8);
    DataStoreSpec::DataStoreSpec(&local_2c4,0x8892,0x88e0,0x305b);
    pDVar10 = DataStoreSpecVecBuilder::operator<<(pDVar10,&local_2c4);
    DataStoreSpec::DataStoreSpec((DataStoreSpec *)&numUploadsPerCase,0x8892,0x88e0,0x23b);
    DataStoreSpecVecBuilder::operator<<(pDVar10,(DataStoreSpec *)&numUploadsPerCase);
    pRVar11 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pvVar12 = std::
              vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
              ::operator[]((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                            *)&builder_5,0);
    sVar13 = std::
             vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
             ::size((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                     *)&builder_5);
    RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
              (pRVar11,pCVar2,"different_size","Recreate with different size",pvVar12,(int)sVar13,
               VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pRVar11);
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
    ::~vector((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)&builder_5);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  de::Random::Random((Random *)
                     ((long)&specs_6.
                             super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0x5d71);
  for (specs_6.
       super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      (int)specs_6.
           super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage < 4;
      specs_6.
      super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
           (int)specs_6.
                super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
    this_00 = (allocator<deqp::gles2::Functional::DataStoreSpec> *)((long)&spec._M_current + 7);
    std::allocator<deqp::gles2::Functional::DataStoreSpec>::allocator(this_00);
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
    ::vector((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
              *)local_310,10,this_00);
    std::allocator<deqp::gles2::Functional::DataStoreSpec>::~allocator
              ((allocator<deqp::gles2::Functional::DataStoreSpec> *)((long)&spec._M_current + 7));
    local_320._M_current =
         (DataStoreSpec *)
         std::
         vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
         ::begin((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                  *)local_310);
    while( true ) {
      local_328._M_current =
           (DataStoreSpec *)
           std::
           vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
           ::end((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                  *)local_310);
      bVar3 = __gnu_cxx::operator!=(&local_320,&local_328);
      if (!bVar3) break;
      iVar5 = de::Random::getInt((Random *)
                                 ((long)&specs_6.
                                         super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0,1
                                );
      dVar6 = init::bufferTargets[iVar5];
      pDVar14 = __gnu_cxx::
                __normal_iterator<deqp::gles2::Functional::DataStoreSpec_*,_std::vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>_>
                ::operator->(&local_320);
      pDVar14->target = dVar6;
      iVar5 = de::Random::getInt((Random *)
                                 ((long)&specs_6.
                                         super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0,2
                                );
      dVar6 = init::usageHints[iVar5];
      pDVar14 = __gnu_cxx::
                __normal_iterator<deqp::gles2::Functional::DataStoreSpec_*,_std::vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>_>
                ::operator->(&local_320);
      pDVar14->usage = dVar6;
      iVar5 = de::Random::getInt((Random *)
                                 ((long)&specs_6.
                                         super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),0xc
                                 ,0x10000);
      pDVar14 = __gnu_cxx::
                __normal_iterator<deqp::gles2::Functional::DataStoreSpec_*,_std::vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>_>
                ::operator->(&local_320);
      pDVar14->size = iVar5;
      local_330 = (DataStoreSpec *)
                  __gnu_cxx::
                  __normal_iterator<deqp::gles2::Functional::DataStoreSpec_*,_std::vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>_>
                  ::operator++(&local_320,0);
    }
    pRVar11 = (RecreateBufferDataStoreCase *)operator_new(0xe0);
    basicGroup_1._3_1_ = 1;
    pCVar2 = (this->super_TestCaseGroup).m_context;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"random_",&local_371);
    basicGroup_1._4_4_ =
         (int)specs_6.
              super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage + 1;
    de::toString<int>(&local_398,(int *)((long)&basicGroup_1 + 4));
    std::operator+(&local_350,&local_370,&local_398);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    pvVar12 = std::
              vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
              ::operator[]((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                            *)local_310,0);
    sVar13 = std::
             vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
             ::size((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                     *)local_310);
    RecreateBufferDataStoreCase::RecreateBufferDataStoreCase
              (pRVar11,pCVar2,pcVar8,"",pvVar12,(int)sVar13,VERIFY_AS_VERTEX_ARRAY);
    basicGroup_1._3_1_ = 0;
    tcu::TestNode::addChild(pTVar7,(TestNode *)pRVar11);
    std::__cxx11::string::~string((string *)&local_350);
    std::__cxx11::string::~string((string *)&local_398);
    std::__cxx11::string::~string((string *)&local_370);
    std::allocator<char>::~allocator(&local_371);
    std::
    vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
    ::~vector((vector<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
               *)local_310);
  }
  de::Random::~Random((Random *)
                      ((long)&specs_6.
                              super__Vector_base<deqp::gles2::Functional::DataStoreSpec,_std::allocator<deqp::gles2::Functional::DataStoreSpec>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "basic_subdata","Basic glBufferSubData() usage");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  for (target_2 = 0; (int)target_2 < 2; target_2 = target_2 + 1) {
    for (usage_2 = 0; (int)usage_2 < 3; usage_2 = usage_2 + 1) {
      dVar6 = init::bufferTargets[(int)target_2];
      dVar1 = init::usageHints[(int)usage_2];
      name_2.field_2._12_4_ = 0x3fc;
      name_2.field_2._8_4_ = 0;
      pcVar8 = BufferTestUtil::getBufferTargetName(dVar6);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_420,pcVar8,(allocator<char> *)((long)&partialSpecifyGroup + 7));
      std::operator+(&local_400,&local_420,"_");
      pcVar8 = BufferTestUtil::getUsageHintName(dVar1);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0,
                     &local_400,pcVar8);
      std::__cxx11::string::~string((string *)&local_400);
      std::__cxx11::string::~string((string *)&local_420);
      std::allocator<char>::~allocator((allocator<char> *)((long)&partialSpecifyGroup + 7));
      pBVar9 = (BasicBufferDataCase *)operator_new(0xd0);
      pCVar2 = (this->super_TestCaseGroup).m_context;
      pcVar8 = (char *)std::__cxx11::string::c_str();
      BasicBufferDataCase::BasicBufferDataCase
                (pBVar9,pCVar2,pcVar8,"",dVar6,dVar1,0x3fc,VERIFY_AS_VERTEX_ARRAY);
      tcu::TestNode::addChild(pTVar7,(TestNode *)pBVar9);
      std::__cxx11::string::~string((string *)local_3e0);
    }
  }
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "partial_specify","Partial buffer data specification with glBufferSubData()");
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  do {
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::vector
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_6);
    RangeVecBuilder::RangeVecBuilder
              (&local_450,
               (vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_6);
    tcu::Vector<int,_2>::Vector
              ((Vector<int,_2> *)
               &ranges_1.
                super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,0,0x3e4);
    RangeVecBuilder::operator<<
              (&local_450,
               (IVec2 *)&ranges_1.
                         super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pSVar15 = (SubDataToUndefinedCase *)operator_new(0xf0);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pvVar16 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::operator[]
                        ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                         &builder_6,0);
    sVar13 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::size
                       ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                        &builder_6);
    SubDataToUndefinedCase::SubDataToUndefinedCase
              (pSVar15,pCVar2,"whole_1","Whole buffer specification with single glBufferSubData()",
               0x8892,0x88e4,0x3e4,pvVar16,(int)sVar13,VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar15);
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~vector
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_6);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::vector
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_7);
    RangeVecBuilder::RangeVecBuilder
              (&local_478,
               (vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_7);
    tcu::Vector<int,_2>::Vector(&local_480,0x2d9,999);
    pRVar17 = RangeVecBuilder::operator<<(&local_478,&local_480);
    tcu::Vector<int,_2>::Vector
              ((Vector<int,_2> *)
               &ranges_2.
                super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,0,0x2d9);
    RangeVecBuilder::operator<<
              (pRVar17,(IVec2 *)&ranges_2.
                                 super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pSVar15 = (SubDataToUndefinedCase *)operator_new(0xf0);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pvVar16 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::operator[]
                        ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                         &builder_7,0);
    sVar13 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::size
                       ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                        &builder_7);
    SubDataToUndefinedCase::SubDataToUndefinedCase
              (pSVar15,pCVar2,"whole_2","Whole buffer specification with two calls",0x8893,0x88e8,
               0x6c0,pvVar16,(int)sVar13,VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar15);
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~vector
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_7);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::vector
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_8);
    RangeVecBuilder::RangeVecBuilder
              (&local_4a8,
               (vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_8);
    tcu::Vector<int,_2>::Vector(&local_4b0,0,0x1a5);
    pRVar17 = RangeVecBuilder::operator<<(&local_4a8,&local_4b0);
    tcu::Vector<int,_2>::Vector(&local_4b8,0x58d,0x20b);
    pRVar17 = RangeVecBuilder::operator<<(pRVar17,&local_4b8);
    tcu::Vector<int,_2>::Vector
              ((Vector<int,_2> *)
               &ranges_3.
                super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,0x1a5,1000);
    RangeVecBuilder::operator<<
              (pRVar17,(IVec2 *)&ranges_3.
                                 super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pSVar15 = (SubDataToUndefinedCase *)operator_new(0xf0);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pvVar16 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::operator[]
                        ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                         &builder_8,0);
    sVar13 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::size
                       ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                        &builder_8);
    SubDataToUndefinedCase::SubDataToUndefinedCase
              (pSVar15,pCVar2,"whole_3","Whole buffer specification with three calls",0x8892,0x88e0,
               0x798,pvVar16,(int)sVar13,VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar15);
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~vector
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_8);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::vector
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_9);
    RangeVecBuilder::RangeVecBuilder
              (&local_4e0,
               (vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_9);
    tcu::Vector<int,_2>::Vector(&local_4e8,0,500);
    pRVar17 = RangeVecBuilder::operator<<(&local_4e0,&local_4e8);
    tcu::Vector<int,_2>::Vector(&local_4f0,0x1ad,200);
    pRVar17 = RangeVecBuilder::operator<<(pRVar17,&local_4f0);
    tcu::Vector<int,_2>::Vector
              ((Vector<int,_2> *)
               &ranges_4.
                super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,0x201,0x2af);
    RangeVecBuilder::operator<<
              (pRVar17,(IVec2 *)&ranges_4.
                                 super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pSVar15 = (SubDataToUndefinedCase *)operator_new(0xf0);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pvVar16 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::operator[]
                        ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                         &builder_9,0);
    sVar13 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::size
                       ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                        &builder_9);
    SubDataToUndefinedCase::SubDataToUndefinedCase
              (pSVar15,pCVar2,"whole_4","Whole buffer specification with three calls",0x8893,0x88e0,
               0x4b0,pvVar16,(int)sVar13,VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar15);
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~vector
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_9);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::vector
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_10);
    RangeVecBuilder::RangeVecBuilder
              (&local_518,
               (vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_10);
    tcu::Vector<int,_2>::Vector
              ((Vector<int,_2> *)
               &ranges_5.
                super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,0,0x201);
    RangeVecBuilder::operator<<
              (&local_518,
               (IVec2 *)&ranges_5.
                         super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pSVar15 = (SubDataToUndefinedCase *)operator_new(0xf0);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pvVar16 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::operator[]
                        ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                         &builder_10,0);
    sVar13 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::size
                       ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                        &builder_10);
    SubDataToUndefinedCase::SubDataToUndefinedCase
              (pSVar15,pCVar2,"low_1","Low part of buffer specified with single call",0x8893,0x88e4,
               1000,pvVar16,(int)sVar13,VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar15);
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~vector
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_10);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::vector
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_11);
    RangeVecBuilder::RangeVecBuilder
              (&local_540,
               (vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_11);
    tcu::Vector<int,_2>::Vector(&local_548,0,0x62);
    pRVar17 = RangeVecBuilder::operator<<(&local_540,&local_548);
    tcu::Vector<int,_2>::Vector
              ((Vector<int,_2> *)
               &ranges_6.
                super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,0x62,0x1ff);
    RangeVecBuilder::operator<<
              (pRVar17,(IVec2 *)&ranges_6.
                                 super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pSVar15 = (SubDataToUndefinedCase *)operator_new(0xf0);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pvVar16 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::operator[]
                        ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                         &builder_11,0);
    sVar13 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::size
                       ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                        &builder_11);
    SubDataToUndefinedCase::SubDataToUndefinedCase
              (pSVar15,pCVar2,"low_2","Low part of buffer specified with two calls",0x8892,0x88e4,
               0x3e4,pvVar16,(int)sVar13,VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar15);
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~vector
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_11);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::vector
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_12);
    RangeVecBuilder::RangeVecBuilder
              (&local_570,
               (vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_12);
    tcu::Vector<int,_2>::Vector(&local_578,0,0x24f);
    pRVar17 = RangeVecBuilder::operator<<(&local_570,&local_578);
    tcu::Vector<int,_2>::Vector
              ((Vector<int,_2> *)
               &ranges_7.
                super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,0x173,400);
    RangeVecBuilder::operator<<
              (pRVar17,(IVec2 *)&ranges_7.
                                 super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pSVar15 = (SubDataToUndefinedCase *)operator_new(0xf0);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pvVar16 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::operator[]
                        ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                         &builder_12,0);
    sVar13 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::size
                       ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                        &builder_12);
    SubDataToUndefinedCase::SubDataToUndefinedCase
              (pSVar15,pCVar2,"low_3","Low part of buffer specified with two calls",0x8892,0x88e8,
               0x4b0,pvVar16,(int)sVar13,VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar15);
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~vector
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_12);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::vector
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_13);
    RangeVecBuilder::RangeVecBuilder
              (&local_5a0,
               (vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_13);
    tcu::Vector<int,_2>::Vector
              ((Vector<int,_2> *)
               &ranges_8.
                super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,500,500);
    RangeVecBuilder::operator<<
              (&local_5a0,
               (IVec2 *)&ranges_8.
                         super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pSVar15 = (SubDataToUndefinedCase *)operator_new(0xf0);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pvVar16 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::operator[]
                        ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                         &builder_13,0);
    sVar13 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::size
                       ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                        &builder_13);
    SubDataToUndefinedCase::SubDataToUndefinedCase
              (pSVar15,pCVar2,"high_1","High part of buffer specified with single call",0x8893,
               0x88e4,1000,pvVar16,(int)sVar13,VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar15);
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~vector
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_13);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::vector
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_14);
    RangeVecBuilder::RangeVecBuilder
              (&local_5c8,
               (vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_14);
    tcu::Vector<int,_2>::Vector(&local_5d0,600,0x7b);
    pRVar17 = RangeVecBuilder::operator<<(&local_5c8,&local_5d0);
    tcu::Vector<int,_2>::Vector
              ((Vector<int,_2> *)
               &ranges_9.
                super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,0x2d3,0x1dd);
    RangeVecBuilder::operator<<
              (pRVar17,(IVec2 *)&ranges_9.
                                 super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pSVar15 = (SubDataToUndefinedCase *)operator_new(0xf0);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pvVar16 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::operator[]
                        ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                         &builder_14,0);
    sVar13 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::size
                       ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                        &builder_14);
    SubDataToUndefinedCase::SubDataToUndefinedCase
              (pSVar15,pCVar2,"high_2","High part of buffer specified with two calls",0x8892,0x88e0,
               0x4b0,pvVar16,(int)sVar13,VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar15);
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~vector
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_14);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::vector
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_15);
    RangeVecBuilder::RangeVecBuilder
              (&local_5f8,
               (vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_15);
    tcu::Vector<int,_2>::Vector(&local_600,600,200);
    pRVar17 = RangeVecBuilder::operator<<(&local_5f8,&local_600);
    tcu::Vector<int,_2>::Vector
              ((Vector<int,_2> *)
               &ranges_10.
                super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,0x259,599);
    RangeVecBuilder::operator<<
              (pRVar17,(IVec2 *)&ranges_10.
                                 super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pSVar15 = (SubDataToUndefinedCase *)operator_new(0xf0);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pvVar16 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::operator[]
                        ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                         &builder_15,0);
    sVar13 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::size
                       ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                        &builder_15);
    SubDataToUndefinedCase::SubDataToUndefinedCase
              (pSVar15,pCVar2,"high_3","High part of buffer specified with two calls",0x8892,0x88e0,
               0x4b0,pvVar16,(int)sVar13,VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar15);
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~vector
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_15);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::vector
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_16);
    RangeVecBuilder::RangeVecBuilder
              (&local_628,
               (vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_16);
    tcu::Vector<int,_2>::Vector
              ((Vector<int,_2> *)
               &ranges_11.
                super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,1000,799);
    RangeVecBuilder::operator<<
              (&local_628,
               (IVec2 *)&ranges_11.
                         super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pSVar15 = (SubDataToUndefinedCase *)operator_new(0xf0);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pvVar16 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::operator[]
                        ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                         &builder_16,0);
    sVar13 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::size
                       ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                        &builder_16);
    SubDataToUndefinedCase::SubDataToUndefinedCase
              (pSVar15,pCVar2,"middle_1","Middle part of buffer specified with single call",0x8893,
               0x88e0,0x9c4,pvVar16,(int)sVar13,VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar15);
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~vector
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_16);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::vector
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_17);
    RangeVecBuilder::RangeVecBuilder
              (&local_650,
               (vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_17);
    tcu::Vector<int,_2>::Vector(&local_658,0x30c,0xdc);
    pRVar17 = RangeVecBuilder::operator<<(&local_650,&local_658);
    tcu::Vector<int,_2>::Vector
              ((Vector<int,_2> *)
               &ranges_12.
                super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,1000,500);
    RangeVecBuilder::operator<<
              (pRVar17,(IVec2 *)&ranges_12.
                                 super__Vector_base<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pSVar15 = (SubDataToUndefinedCase *)operator_new(0xf0);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pvVar16 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::operator[]
                        ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                         &builder_17,0);
    sVar13 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::size
                       ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                        &builder_17);
    SubDataToUndefinedCase::SubDataToUndefinedCase
              (pSVar15,pCVar2,"middle_2","Middle part of buffer specified with two calls",0x8893,
               0x88e4,0x9c4,pvVar16,(int)sVar13,VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar15);
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~vector
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_17);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  do {
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::vector
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_18);
    RangeVecBuilder::RangeVecBuilder
              (&local_680,
               (vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_18);
    tcu::Vector<int,_2>::Vector(&local_688,0x30c,0x141);
    pRVar17 = RangeVecBuilder::operator<<(&local_680,&local_688);
    tcu::Vector<int,_2>::Vector((Vector<int,_2> *)&randomGroup,1000,0x1f5);
    RangeVecBuilder::operator<<(pRVar17,(IVec2 *)&randomGroup);
    pSVar15 = (SubDataToUndefinedCase *)operator_new(0xf0);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    pvVar16 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::operator[]
                        ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                         &builder_18,0);
    sVar13 = std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::size
                       ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)
                        &builder_18);
    SubDataToUndefinedCase::SubDataToUndefinedCase
              (pSVar15,pCVar2,"middle_3","Middle part of buffer specified with two calls",0x8892,
               0x88e8,0x9c4,pvVar16,(int)sVar13,VERIFY_AS_VERTEX_ARRAY);
    tcu::TestNode::addChild(pTVar7,(TestNode *)pSVar15);
    std::vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_>::~vector
              ((vector<tcu::Vector<int,_2>,_std::allocator<tcu::Vector<int,_2>_>_> *)&builder_18);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  pTVar7 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar7,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"random",
             "Randomized buffer data cases");
  pTStack_698 = pTVar7;
  tcu::TestNode::addChild((TestNode *)this,pTVar7);
  local_69c = 0;
  uVar18 = extraout_RAX;
  while (pTVar7 = pTStack_698, (int)local_69c < 10) {
    this_01 = (RandomBufferWriteCase *)operator_new(0x110);
    pCVar2 = (this->super_TestCaseGroup).m_context;
    de::toString<int>(&local_6c0,(int *)&local_69c);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    dVar6 = ::deInt32Hash(local_69c);
    RandomBufferWriteCase::RandomBufferWriteCase(this_01,pCVar2,pcVar8,"",dVar6);
    tcu::TestNode::addChild(pTVar7,(TestNode *)this_01);
    std::__cxx11::string::~string((string *)&local_6c0);
    local_69c = local_69c + 1;
    uVar18 = (ulong)local_69c;
  }
  return (int)uVar18;
}

Assistant:

void BufferWriteTests::init (void)
{
	static const deUint32 bufferTargets[] =
	{
		GL_ARRAY_BUFFER,
		GL_ELEMENT_ARRAY_BUFFER
	};

	static const deUint32 usageHints[] =
	{
		GL_STREAM_DRAW,
		GL_STATIC_DRAW,
		GL_DYNAMIC_DRAW
	};

	static const struct
	{
		const char*	name;
		VerifyType	verify;
	} verifyTypes[] =
	{
		{ "vertex_array",	VERIFY_AS_VERTEX_ARRAY	},
		{ "index_array",	VERIFY_AS_INDEX_ARRAY	}
	};

	// .basic
	{
		tcu::TestCaseGroup* const basicGroup = new tcu::TestCaseGroup(m_testCtx, "basic", "Basic upload with glBufferData()");
		addChild(basicGroup);

		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
		{
			for (int usageNdx = 0; usageNdx < DE_LENGTH_OF_ARRAY(usageHints); usageNdx++)
			{
				const deUint32		target	= bufferTargets[targetNdx];
				const deUint32		usage	= usageHints[usageNdx];
				const int			size	= 1020;
				const VerifyType	verify	= VERIFY_AS_VERTEX_ARRAY;
				const string		name	= string(getBufferTargetName(target)) + "_" + getUsageHintName(usage);

				basicGroup->addChild(new BasicBufferDataCase(m_context, name.c_str(), "", target, usage, size, verify));
			}
		}
	}

	// .use
	{
		tcu::TestCaseGroup* const useGroup = new tcu::TestCaseGroup(m_testCtx, "use", "Buffer uses");
		addChild(useGroup);

		for (int verifyNdx = 0; verifyNdx < DE_LENGTH_OF_ARRAY(verifyTypes); verifyNdx++)
		{
			tcu::TestCaseGroup* const verifyGroup = new tcu::TestCaseGroup(m_testCtx, verifyTypes[verifyNdx].name, "");
			useGroup->addChild(verifyGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
			{
				const deUint32		target	= bufferTargets[targetNdx];
				const deUint32		usage	= GL_STATIC_DRAW;
				const int			size	= 763;
				const VerifyType	verify	= verifyTypes[verifyNdx].verify;
				const string		name	= getBufferTargetName(target);

				verifyGroup->addChild(new BasicBufferDataCase(m_context, name.c_str(), "", target, usage, size, verify));
			}
		}
	}

	// .recreate_store
	{
		tcu::TestCaseGroup* const recreateStoreGroup = new tcu::TestCaseGroup(m_testCtx, "recreate_store", "Data store recreate using glBufferData()");
		addChild(recreateStoreGroup);

#define RECREATE_STORE_CASE(NAME, DESC, SPECLIST)																											\
		do {																																				\
			std::vector<DataStoreSpec> specs;																												\
			DataStoreSpecVecBuilder builder(specs);																											\
			builder SPECLIST;																																\
			recreateStoreGroup->addChild(new RecreateBufferDataStoreCase(m_context, #NAME, DESC, &specs[0], (int)specs.size(), VERIFY_AS_VERTEX_ARRAY));	\
		} while (deGetFalse())

		RECREATE_STORE_CASE(identical_1, "Recreate with identical parameters",
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STATIC_DRAW, 996)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STATIC_DRAW, 996)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STATIC_DRAW, 996));

		RECREATE_STORE_CASE(identical_2, "Recreate with identical parameters",
			<< DataStoreSpec(GL_ELEMENT_ARRAY_BUFFER, GL_STATIC_DRAW, 72)
			<< DataStoreSpec(GL_ELEMENT_ARRAY_BUFFER, GL_STATIC_DRAW, 72)
			<< DataStoreSpec(GL_ELEMENT_ARRAY_BUFFER, GL_STATIC_DRAW, 72));

		RECREATE_STORE_CASE(different_target_1, "Recreate with different target",
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STATIC_DRAW, 504)
			<< DataStoreSpec(GL_ELEMENT_ARRAY_BUFFER,		GL_STATIC_DRAW, 504));

		RECREATE_STORE_CASE(different_target_2, "Recreate with different target",
			<< DataStoreSpec(GL_ELEMENT_ARRAY_BUFFER,		GL_STATIC_DRAW, 716)
			<< DataStoreSpec(GL_ARRAY_BUFFER,				GL_STATIC_DRAW, 716)
			<< DataStoreSpec(GL_ELEMENT_ARRAY_BUFFER,		GL_STATIC_DRAW, 716));

		RECREATE_STORE_CASE(different_usage, "Recreate with different usage",
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STREAM_DRAW,	1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_DYNAMIC_DRAW,	1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STATIC_DRAW,	1644)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STREAM_DRAW,	1644));

		RECREATE_STORE_CASE(different_size, "Recreate with different size",
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STREAM_DRAW,	1024)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STREAM_DRAW,	12)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STREAM_DRAW,	3327)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STREAM_DRAW,	92)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STREAM_DRAW,	12379)
			<< DataStoreSpec(GL_ARRAY_BUFFER, GL_STREAM_DRAW,	571));

#undef RECREATE_STORE_CASE

		// Random cases.
		{
			const int			numRandomCases		= 4;
			const int			numUploadsPerCase	= 10;
			const int			minSize				= 12;
			const int			maxSize				= 65536;
			const VerifyType	verify				= VERIFY_AS_VERTEX_ARRAY;
			de::Random			rnd					(23921);

			for (int caseNdx = 0; caseNdx < numRandomCases; caseNdx++)
			{
				vector<DataStoreSpec> specs(numUploadsPerCase);

				for (vector<DataStoreSpec>::iterator spec = specs.begin(); spec != specs.end(); spec++)
				{
					spec->target	= bufferTargets[rnd.getInt(0, DE_LENGTH_OF_ARRAY(bufferTargets)-1)];
					spec->usage		= usageHints[rnd.getInt(0, DE_LENGTH_OF_ARRAY(usageHints)-1)];
					spec->size		= rnd.getInt(minSize, maxSize);
				}

				recreateStoreGroup->addChild(new RecreateBufferDataStoreCase(m_context, (string("random_") + de::toString(caseNdx+1)).c_str(), "", &specs[0], (int)specs.size(), verify));
			}
		}
	}

	// .basic_subdata
	{
		tcu::TestCaseGroup* const basicGroup = new tcu::TestCaseGroup(m_testCtx, "basic_subdata", "Basic glBufferSubData() usage");
		addChild(basicGroup);

		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(bufferTargets); targetNdx++)
		{
			for (int usageNdx = 0; usageNdx < DE_LENGTH_OF_ARRAY(usageHints); usageNdx++)
			{
				const deUint32		target	= bufferTargets[targetNdx];
				const deUint32		usage	= usageHints[usageNdx];
				const int			size	= 1020;
				const VerifyType	verify	= VERIFY_AS_VERTEX_ARRAY;
				const string		name	= string(getBufferTargetName(target)) + "_" + getUsageHintName(usage);

				basicGroup->addChild(new BasicBufferDataCase(m_context, name.c_str(), "", target, usage, size, verify));
			}
		}
	}

	// .partial_specify
	{
		tcu::TestCaseGroup* const partialSpecifyGroup = new tcu::TestCaseGroup(m_testCtx, "partial_specify", "Partial buffer data specification with glBufferSubData()");
		addChild(partialSpecifyGroup);

#define PARTIAL_SPECIFY_CASE(NAME, DESC, TARGET, USAGE, SIZE, RANGELIST)																									\
		do {																																								\
			std::vector<tcu::IVec2> ranges;																																	\
			RangeVecBuilder builder(ranges);																																\
			builder RANGELIST;																																				\
			partialSpecifyGroup->addChild(new SubDataToUndefinedCase(m_context, #NAME, DESC, TARGET, USAGE, SIZE, &ranges[0], (int)ranges.size(), VERIFY_AS_VERTEX_ARRAY));	\
		} while (deGetFalse())

		PARTIAL_SPECIFY_CASE(whole_1, "Whole buffer specification with single glBufferSubData()", GL_ARRAY_BUFFER, GL_STATIC_DRAW, 996,
			<< IVec2(0, 996));
		PARTIAL_SPECIFY_CASE(whole_2, "Whole buffer specification with two calls", GL_ELEMENT_ARRAY_BUFFER, GL_DYNAMIC_DRAW, 1728,
			<< IVec2(729, 999)
			<< IVec2(0, 729));
		PARTIAL_SPECIFY_CASE(whole_3, "Whole buffer specification with three calls", GL_ARRAY_BUFFER, GL_STREAM_DRAW, 1944,
			<< IVec2(0, 421)
			<< IVec2(1421, 523)
			<< IVec2(421, 1000));
		PARTIAL_SPECIFY_CASE(whole_4, "Whole buffer specification with three calls", GL_ELEMENT_ARRAY_BUFFER, GL_STREAM_DRAW, 1200,
			<< IVec2(0, 500)
			<< IVec2(429, 200)
			<< IVec2(513, 687));

		PARTIAL_SPECIFY_CASE(low_1, "Low part of buffer specified with single call", GL_ELEMENT_ARRAY_BUFFER, GL_STATIC_DRAW, 1000,
			<< IVec2(0, 513));
		PARTIAL_SPECIFY_CASE(low_2, "Low part of buffer specified with two calls", GL_ARRAY_BUFFER, GL_STATIC_DRAW, 996,
			<< IVec2(0, 98)
			<< IVec2(98, 511));
		PARTIAL_SPECIFY_CASE(low_3, "Low part of buffer specified with two calls", GL_ARRAY_BUFFER, GL_DYNAMIC_DRAW, 1200,
			<< IVec2(0, 591)
			<< IVec2(371, 400));

		PARTIAL_SPECIFY_CASE(high_1, "High part of buffer specified with single call", GL_ELEMENT_ARRAY_BUFFER, GL_STATIC_DRAW, 1000,
			<< IVec2(500, 500));
		PARTIAL_SPECIFY_CASE(high_2, "High part of buffer specified with two calls", GL_ARRAY_BUFFER, GL_STREAM_DRAW, 1200,
			<< IVec2(600, 123)
			<< IVec2(723, 477));
		PARTIAL_SPECIFY_CASE(high_3, "High part of buffer specified with two calls", GL_ARRAY_BUFFER, GL_STREAM_DRAW, 1200,
			<< IVec2(600, 200)
			<< IVec2(601, 599));

		PARTIAL_SPECIFY_CASE(middle_1, "Middle part of buffer specified with single call", GL_ELEMENT_ARRAY_BUFFER, GL_STREAM_DRAW, 2500,
			<< IVec2(1000, 799));
		PARTIAL_SPECIFY_CASE(middle_2, "Middle part of buffer specified with two calls", GL_ELEMENT_ARRAY_BUFFER, GL_STATIC_DRAW, 2500,
			<< IVec2(780, 220)
			<< IVec2(1000, 500));
		PARTIAL_SPECIFY_CASE(middle_3, "Middle part of buffer specified with two calls", GL_ARRAY_BUFFER, GL_DYNAMIC_DRAW, 2500,
			<< IVec2(780, 321)
			<< IVec2(1000, 501));

#undef PARTIAL_SPECIFY_CASE
	}

	// .random
	{
		tcu::TestCaseGroup* const randomGroup = new tcu::TestCaseGroup(m_testCtx, "random", "Randomized buffer data cases");
		addChild(randomGroup);

		for (int i = 0; i < 10; i++)
			randomGroup->addChild(new RandomBufferWriteCase(m_context, de::toString(i).c_str(), "", deInt32Hash(i)));
	}
}